

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CellTypeBuilder.cpp
# Opt level: O3

shared_ptr<CellType> __thiscall CellTypeBuilder::getProduct(CellTypeBuilder *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CellTypeBuilder *in_RSI;
  shared_ptr<CellType> sVar2;
  
  (this->super_AbstractCellTypeBuilder)._vptr_AbstractCellTypeBuilder =
       (_func_int **)
       (in_RSI->cellPtr).super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1 = (element_type *)
           (in_RSI->cellPtr).super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (in_RSI->cellPtr).super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->cellPtr).super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (in_RSI->cellPtr).super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  reset(in_RSI);
  sVar2.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<CellType>)sVar2.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CellType> CellTypeBuilder::getProduct() {
  std::shared_ptr<CellType> oldPtr = std::move(cellPtr);
  reset();
  return oldPtr;
}